

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::setCommonBlendState(Functions *gl,BlendState *blend)

{
  GLenum GVar1;
  GLenum GVar2;
  glColorMaskFunc p_Var3;
  glBlendEquationFunc p_Var4;
  glBlendEquationSeparateFunc p_Var5;
  glBlendFuncFunc p_Var6;
  glBlendFuncSeparateFunc p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  GLenum GVar12;
  bool *pbVar13;
  Vector<bool,_4> *this;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *this_00;
  uint *puVar14;
  SeparateBlendEq *pSVar15;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *this_01;
  BlendFunc *pBVar16;
  SeparateBlendFunc *pSVar17;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *blendFunc;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *blendEq;
  BVec4 *mask;
  BlendState *blend_local;
  Functions *gl_local;
  
  bVar8 = tcu::Maybe::operator_cast_to_bool((Maybe *)blend);
  if (bVar8) {
    pbVar13 = tcu::Maybe<bool>::operator*(&blend->enableBlend);
    if ((*pbVar13 & 1U) == 0) {
      (*gl->disable)(0xbe2);
    }
    else {
      (*gl->enable)(0xbe2);
    }
  }
  bVar8 = tcu::Maybe::operator_cast_to_bool((Maybe *)&blend->colorMask);
  if (bVar8) {
    this = tcu::Maybe<tcu::Vector<bool,_4>_>::operator*(&blend->colorMask);
    p_Var3 = gl->colorMask;
    bVar8 = tcu::Vector<bool,_4>::x(this);
    bVar9 = tcu::Vector<bool,_4>::y(this);
    bVar10 = tcu::Vector<bool,_4>::z(this);
    bVar11 = tcu::Vector<bool,_4>::w(this);
    (*p_Var3)(bVar8,bVar9,bVar10,bVar11);
  }
  bVar8 = tcu::Maybe::operator_cast_to_bool((Maybe *)&blend->blendEq);
  if (bVar8) {
    this_00 = tcu::
              Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              ::operator*(&blend->blendEq);
    bVar8 = tcu::
            Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
            is<unsigned_int>(this_00);
    if (bVar8) {
      p_Var4 = gl->blendEquation;
      puVar14 = tcu::
                Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                ::get<unsigned_int>(this_00);
      (*p_Var4)(*puVar14);
    }
    else {
      bVar8 = tcu::
              Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
              ::is<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>(this_00);
      if (bVar8) {
        p_Var5 = gl->blendEquationSeparate;
        pSVar15 = tcu::
                  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                  ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>(this_00);
        GVar12 = pSVar15->rgb;
        pSVar15 = tcu::
                  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                  ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>(this_00);
        (*p_Var5)(GVar12,pSVar15->alpha);
      }
    }
  }
  bVar8 = tcu::Maybe::operator_cast_to_bool((Maybe *)&blend->blendFunc);
  if (bVar8) {
    this_01 = tcu::
              Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              ::operator*(&blend->blendFunc);
    bVar8 = tcu::
            Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
            ::is<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc>(this_01);
    if (bVar8) {
      p_Var6 = gl->blendFunc;
      pBVar16 = tcu::
                Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                ::get<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc>(this_01);
      GVar12 = pBVar16->src;
      pBVar16 = tcu::
                Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                ::get<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc>(this_01);
      (*p_Var6)(GVar12,pBVar16->dst);
    }
    else {
      bVar8 = tcu::
              Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
              ::is<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>(this_01);
      if (bVar8) {
        p_Var7 = gl->blendFuncSeparate;
        pSVar17 = tcu::
                  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                  ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>(this_01)
        ;
        GVar12 = (pSVar17->rgb).src;
        pSVar17 = tcu::
                  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                  ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>(this_01)
        ;
        GVar1 = (pSVar17->rgb).dst;
        pSVar17 = tcu::
                  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                  ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>(this_01)
        ;
        GVar2 = (pSVar17->alpha).src;
        pSVar17 = tcu::
                  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                  ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>(this_01)
        ;
        (*p_Var7)(GVar12,GVar1,GVar2,(pSVar17->alpha).dst);
      }
    }
  }
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"Failed to set common blend state.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                  ,0xe2);
  return;
}

Assistant:

void setCommonBlendState (const glw::Functions& gl, const BlendState& blend)
{
	if (blend.enableBlend)
	{
		if (*blend.enableBlend)
			gl.enable(GL_BLEND);
		else
			gl.disable(GL_BLEND);
	}

	if (blend.colorMask)
	{
		const BVec4& mask = *blend.colorMask;

		gl.colorMask(mask.x(), mask.y(), mask.z(), mask.w());
	}

	if (blend.blendEq)
	{
		const Either<BlendEq, SeparateBlendEq>& blendEq = *blend.blendEq;

		if (blendEq.is<BlendEq>())
			gl.blendEquation(blendEq.get<BlendEq>());
		else if (blendEq.is<SeparateBlendEq>())
			gl.blendEquationSeparate(blendEq.get<SeparateBlendEq>().rgb, blendEq.get<SeparateBlendEq>().alpha);
		else
			DE_ASSERT(false);
	}

	if (blend.blendFunc)
	{
		const Either<BlendFunc, SeparateBlendFunc>& blendFunc = *blend.blendFunc;

		if (blendFunc.is<BlendFunc>())
			gl.blendFunc(blendFunc.get<BlendFunc>().src, blendFunc.get<BlendFunc>().dst);
		else if (blendFunc.is<SeparateBlendFunc>())
			gl.blendFuncSeparate(blendFunc.get<SeparateBlendFunc>().rgb.src, blendFunc.get<SeparateBlendFunc>().rgb.dst, blendFunc.get<SeparateBlendFunc>().alpha.src, blendFunc.get<SeparateBlendFunc>().alpha.dst);
		else
			DE_ASSERT(false);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set common blend state.");
}